

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O2

int __thiscall mp::ReadError::init(ReadError *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  char *__s;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  void *in_stack_00000008;
  size_t in_stack_00000010;
  MemoryWriter w;
  allocator<char> local_291;
  int local_290;
  int local_288;
  int local_284;
  string local_280;
  BasicCStringRef<char> local_260;
  BasicMemoryWriter<char,_std::allocator<char>_> local_258;
  
  local_260.data_ = (char *)ctx;
  local_290 = in_R8D;
  std::__cxx11::string::assign((char *)&this->filename_);
  this->line_ = in_EDX;
  this->column_ = in_ECX;
  local_258.super_BasicWriter<char>.buffer_ = &local_258.buffer_.super_Buffer<char>;
  local_258.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_002b01a0;
  local_258.buffer_.super_Buffer<char>.ptr_ = local_258.buffer_.data_;
  local_258.buffer_.super_Buffer<char>.size_ = 0;
  local_258.buffer_.super_Buffer<char>.capacity_ = 500;
  local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002b01e8;
  fmt::BasicWriter<char>::write<fmt::BasicCStringRef<char>,int,int>
            (&local_258.super_BasicWriter<char>,(BasicCStringRef<char>)0x20e39c,&local_260,
             &local_284,&local_288);
  fmt::BasicWriter<char>::write
            (&local_258.super_BasicWriter<char>,local_290,in_stack_00000008,in_stack_00000010);
  __s = fmt::BasicWriter<char>::c_str(&local_258.super_BasicWriter<char>);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,__s,&local_291);
  Error::SetMessage(&this->super_Error,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_258);
  return extraout_EAX;
}

Assistant:

void mp::ReadError::init(fmt::CStringRef filename, int line, int column,
                         fmt::CStringRef format_str, fmt::ArgList args) {
  filename_ = filename.c_str();
  line_ = line;
  column_ = column;
  fmt::MemoryWriter w;
  w.write("{}:{}:{}: ", filename, line, column);
  w.write(format_str, args);
  SetMessage(w.c_str());
}